

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::CoverpointSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,CoverpointSyntax *this,size_t index)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  __index_type _Var2;
  CoverageIffClauseSyntax *pCVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  switch(index) {
  case 0:
    pSVar1 = &(this->super_MemberSyntax).attributes;
    goto LAB_002fe6ee;
  case 1:
    pCVar3 = (CoverageIffClauseSyntax *)(this->type).ptr;
    break;
  case 2:
    pCVar3 = (CoverageIffClauseSyntax *)this->label;
    break;
  case 3:
    uVar4._0_2_ = (this->coverpoint).kind;
    uVar4._2_1_ = (this->coverpoint).field_0x2;
    uVar4._3_1_ = (this->coverpoint).numFlags;
    uVar5 = (this->coverpoint).rawLen;
    uVar6 = *(undefined4 *)&(this->coverpoint).info;
    uVar7 = *(undefined4 *)((long)&(this->coverpoint).info + 4);
    goto LAB_002fe71e;
  case 4:
    pCVar3 = (CoverageIffClauseSyntax *)(this->expr).ptr;
    break;
  case 5:
    pCVar3 = this->iff;
    break;
  case 6:
    uVar4._0_2_ = (this->openBrace).kind;
    uVar4._2_1_ = (this->openBrace).field_0x2;
    uVar4._3_1_ = (this->openBrace).numFlags;
    uVar5 = (this->openBrace).rawLen;
    uVar6 = *(undefined4 *)&(this->openBrace).info;
    uVar7 = *(undefined4 *)((long)&(this->openBrace).info + 4);
    goto LAB_002fe71e;
  case 7:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->members).super_SyntaxListBase;
LAB_002fe6ee:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
    goto LAB_002fe700;
  case 8:
    uVar4._0_2_ = (this->closeBrace).kind;
    uVar4._2_1_ = (this->closeBrace).field_0x2;
    uVar4._3_1_ = (this->closeBrace).numFlags;
    uVar5 = (this->closeBrace).rawLen;
    uVar6 = *(undefined4 *)&(this->closeBrace).info;
    uVar7 = *(undefined4 *)((long)&(this->closeBrace).info + 4);
    goto LAB_002fe71e;
  case 9:
    uVar4._0_2_ = (this->emptySemi).kind;
    uVar4._2_1_ = (this->emptySemi).field_0x2;
    uVar4._3_1_ = (this->emptySemi).numFlags;
    uVar5 = (this->emptySemi).rawLen;
    uVar6 = *(undefined4 *)&(this->emptySemi).info;
    uVar7 = *(undefined4 *)((long)&(this->emptySemi).info + 4);
LAB_002fe71e:
    *(undefined4 *)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar4
    ;
    *(uint32_t *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 4) = uVar5;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 8) = uVar6;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 0xc) = uVar7;
LAB_002fe721:
    _Var2 = '\0';
    goto LAB_002fe723;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_002fe721;
  }
  *(CoverageIffClauseSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pCVar3;
LAB_002fe700:
  _Var2 = '\x01';
LAB_002fe723:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax CoverpointSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return type.get();
        case 2: return label;
        case 3: return coverpoint;
        case 4: return expr.get();
        case 5: return iff;
        case 6: return openBrace;
        case 7: return &members;
        case 8: return closeBrace;
        case 9: return emptySemi;
        default: return nullptr;
    }
}